

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_expr.hpp
# Opt level: O0

string * __thiscall
viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>::deep_str_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  element_type *peVar1;
  element_type *peVar2;
  string local_1f0 [48];
  string local_1c0 [32];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  void *local_18;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> *this_local;
  
  local_18 = this;
  this_local = (rt_unary_expr<viennamath::rt_expression_interface<double>_> *)__return_storage_ptr__
  ;
  std::__cxx11::stringstream::stringstream(local_1a0);
  peVar1 = std::auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_>::
           operator->((auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_>
                       *)((long)this + 0x10));
  (*peVar1->_vptr_op_interface[3])(local_1c0);
  std::operator<<(local_190,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::operator<<(local_190,"(");
  peVar2 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->
                     ((auto_ptr<viennamath::rt_expression_interface<double>_> *)((long)this + 8));
  (*peVar2->_vptr_rt_expression_interface[3])(local_1f0);
  std::operator<<(local_190,local_1f0);
  std::__cxx11::string::~string(local_1f0);
  std::operator<<(local_190,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string deep_str() const
      {
        std::stringstream ss;
        ss << op_->str();
        ss << "(";
        ss << expr_->deep_str();
        ss << ")";
        return ss.str();
      }